

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O2

FormulaList * __thiscall FOOLElimination::process(FOOLElimination *this,FormulaList *formulas)

{
  Formula *pFVar1;
  FormulaList *pFVar2;
  List<Kernel::Formula_*> **ppLVar3;
  FormulaList *res;
  
  ppLVar3 = &res;
  res = (FormulaList *)0x0;
  for (; formulas != (FormulaList *)0x0; formulas = formulas->_tail) {
    pFVar1 = process(this,formulas->_head);
    pFVar2 = (FormulaList *)Lib::List<Kernel::Formula*>::operator_new(0x10);
    pFVar2->_head = pFVar1;
    pFVar2->_tail = (List<Kernel::Formula_*> *)0x0;
    *ppLVar3 = pFVar2;
    ppLVar3 = &pFVar2->_tail;
  }
  return res;
}

Assistant:

FormulaList* FOOLElimination::process(FormulaList* formulas) {
  FormulaList*  res = FormulaList::empty();
  FormulaList** ipt = &res;

  while (!FormulaList::isEmpty(formulas)) {
    Formula* processed = process(formulas->head());
    *ipt = new FormulaList(processed,FormulaList::empty());
    ipt = (*ipt)->tailPtr();
    formulas = formulas->tail();
  }

  return res;

  // return FormulaList::isEmpty(formulas) ? formulas : new FormulaList(process(formulas->head()), process(formulas->tail()));
}